

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::deviceProperties(TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  VkPhysicalDeviceLimits *value;
  TestLog *pTVar2;
  bool bVar3;
  deUint32 ndx;
  InstanceInterface *pIVar4;
  VkPhysicalDevice pVVar5;
  long lVar6;
  MessageBuilder *pMVar7;
  size_t sVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint *value_00;
  long lVar12;
  int *piVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  float fVar17;
  ApiVersion AVar18;
  ApiVersion AVar19;
  MessageBuilder local_1c98;
  undefined1 local_1b18 [8];
  char *local_1b10;
  undefined1 local_1b08 [16];
  float afStack_1af8 [2];
  int aiStack_1af0 [4];
  char *local_1ae0;
  undefined4 local_1ad8;
  undefined8 local_1ad4;
  undefined8 uStack_1acc;
  undefined8 local_1ac4;
  undefined8 uStack_1abc;
  char *local_1ab0;
  undefined4 local_1aa8;
  undefined8 local_1aa4;
  undefined8 uStack_1a9c;
  undefined8 local_1a94;
  undefined8 uStack_1a8c;
  char *local_1a80;
  undefined4 local_1a78;
  undefined8 local_1a74;
  undefined8 uStack_1a6c;
  undefined8 local_1a64;
  undefined8 uStack_1a5c;
  char *local_1a50;
  undefined4 local_1a48;
  undefined8 local_1a44;
  undefined8 uStack_1a3c;
  undefined8 local_1a34;
  undefined8 uStack_1a2c;
  char *local_1a20;
  undefined4 local_1a18;
  undefined8 local_1a14;
  undefined8 uStack_1a0c;
  undefined8 local_1a04;
  undefined8 uStack_19fc;
  char *local_19f0;
  undefined4 local_19e8;
  undefined8 local_19e4;
  undefined8 uStack_19dc;
  undefined8 local_19d4;
  undefined8 uStack_19cc;
  char *local_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined4 local_19a8;
  undefined8 local_19a4;
  undefined8 uStack_199c;
  char *local_1990;
  undefined4 local_1988;
  undefined8 local_1984;
  undefined8 uStack_197c;
  undefined8 local_1974;
  undefined8 uStack_196c;
  char *local_1960;
  undefined4 local_1958;
  undefined8 local_1954;
  undefined8 uStack_194c;
  undefined8 local_1944;
  undefined8 uStack_193c;
  char *local_1930;
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined4 local_1918;
  undefined8 local_1914;
  undefined8 uStack_190c;
  char *local_1900;
  undefined8 local_18f8;
  undefined8 local_18f0;
  undefined4 local_18e8;
  undefined8 local_18e4;
  undefined8 uStack_18dc;
  char *local_18d0;
  undefined8 local_18c8;
  undefined8 local_18c0;
  undefined4 local_18b8;
  undefined8 local_18b4;
  undefined8 uStack_18ac;
  char *local_18a0;
  undefined8 local_1898;
  undefined8 local_1890;
  undefined4 local_1888;
  undefined8 local_1884;
  undefined8 uStack_187c;
  char *local_1870;
  undefined4 local_1868;
  undefined8 local_1864;
  undefined8 uStack_185c;
  undefined8 local_1854;
  undefined8 uStack_184c;
  char *local_1840;
  undefined4 local_1838;
  undefined8 local_1834;
  undefined8 uStack_182c;
  undefined8 local_1824;
  undefined8 uStack_181c;
  char *local_1810;
  undefined4 local_1808;
  undefined8 local_1804;
  undefined8 uStack_17fc;
  undefined8 local_17f4;
  undefined8 uStack_17ec;
  char *local_17e0;
  undefined4 local_17d8;
  undefined8 local_17d4;
  undefined8 uStack_17cc;
  undefined8 local_17c4;
  undefined8 uStack_17bc;
  char *local_17b0;
  undefined4 local_17a8;
  undefined8 local_17a4;
  undefined8 uStack_179c;
  undefined8 local_1794;
  undefined8 uStack_178c;
  char *local_1780;
  undefined4 local_1778;
  undefined8 local_1774;
  undefined8 uStack_176c;
  undefined8 local_1764;
  undefined8 uStack_175c;
  char *local_1750;
  undefined4 local_1748;
  undefined8 local_1744;
  undefined8 uStack_173c;
  undefined8 local_1734;
  undefined8 uStack_172c;
  char *local_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined4 local_1708;
  undefined8 local_1704;
  undefined8 uStack_16fc;
  char *local_16f0;
  undefined4 local_16e8;
  undefined8 local_16e4;
  undefined8 uStack_16dc;
  undefined8 local_16d4;
  undefined8 uStack_16cc;
  char *local_16c0;
  undefined4 local_16b8;
  undefined8 local_16b4;
  undefined8 uStack_16ac;
  undefined8 local_16a4;
  undefined8 uStack_169c;
  char *local_1690;
  undefined4 local_1688;
  undefined8 local_1684;
  undefined8 uStack_167c;
  undefined8 local_1674;
  undefined8 uStack_166c;
  char *local_1660;
  undefined4 local_1658;
  undefined8 local_1654;
  undefined8 uStack_164c;
  undefined8 local_1644;
  undefined8 uStack_163c;
  char *local_1630;
  undefined4 local_1628;
  undefined8 local_1624;
  undefined8 uStack_161c;
  undefined8 local_1614;
  undefined8 uStack_160c;
  char *local_1600;
  undefined4 local_15f8;
  undefined8 local_15f4;
  undefined8 uStack_15ec;
  undefined8 local_15e4;
  undefined8 uStack_15dc;
  char *local_15d0;
  undefined4 local_15c8;
  undefined8 local_15c4;
  undefined8 uStack_15bc;
  undefined8 local_15b4;
  undefined8 uStack_15ac;
  char *local_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined4 local_1588;
  undefined8 local_1584;
  undefined8 uStack_157c;
  char *local_1570;
  undefined4 local_1568;
  undefined8 local_1564;
  undefined8 uStack_155c;
  undefined8 local_1554;
  undefined8 uStack_154c;
  char *local_1540;
  undefined4 local_1538;
  undefined8 local_1534;
  undefined8 uStack_152c;
  undefined8 local_1524;
  undefined8 uStack_151c;
  char *local_1510;
  undefined4 local_1508;
  undefined8 local_1504;
  undefined8 uStack_14fc;
  undefined8 local_14f4;
  undefined8 uStack_14ec;
  char *local_14e0;
  undefined4 local_14d8;
  undefined8 local_14d4;
  undefined8 uStack_14cc;
  undefined8 local_14c4;
  undefined8 uStack_14bc;
  char *local_14b0;
  undefined4 local_14a8;
  undefined8 local_14a4;
  undefined8 uStack_149c;
  undefined8 local_1494;
  undefined8 uStack_148c;
  char *local_1480;
  undefined4 local_1478;
  undefined8 local_1474;
  undefined8 uStack_146c;
  undefined8 local_1464;
  undefined8 uStack_145c;
  char *local_1450;
  undefined4 local_1448;
  undefined8 local_1444;
  undefined8 uStack_143c;
  undefined8 local_1434;
  undefined8 uStack_142c;
  char *local_1420;
  undefined4 local_1418;
  undefined8 local_1414;
  undefined8 uStack_140c;
  undefined8 local_1404;
  undefined8 uStack_13fc;
  char *local_13f0;
  undefined4 local_13e8;
  undefined8 local_13e4;
  undefined8 uStack_13dc;
  undefined8 local_13d4;
  undefined8 uStack_13cc;
  char *local_13c0;
  undefined4 local_13b8;
  undefined8 local_13b4;
  undefined8 uStack_13ac;
  undefined8 local_13a4;
  undefined8 uStack_139c;
  char *local_1390;
  undefined4 local_1388;
  undefined8 local_1384;
  undefined8 uStack_137c;
  undefined8 local_1374;
  undefined8 uStack_136c;
  char *local_1360;
  undefined4 local_1358;
  undefined8 local_1354;
  undefined8 uStack_134c;
  undefined8 local_1344;
  undefined8 uStack_133c;
  char *local_1330;
  undefined4 local_1328;
  undefined8 local_1324;
  undefined8 uStack_131c;
  undefined8 local_1314;
  undefined8 uStack_130c;
  char *local_1300;
  undefined4 local_12f8;
  undefined8 local_12f4;
  undefined8 uStack_12ec;
  undefined8 local_12e4;
  undefined8 uStack_12dc;
  char *local_12d0;
  undefined4 local_12c8;
  undefined8 local_12c4;
  undefined8 uStack_12bc;
  undefined8 local_12b4;
  undefined8 uStack_12ac;
  char *local_12a0;
  undefined4 local_1298;
  undefined8 local_1294;
  undefined8 uStack_128c;
  undefined8 local_1284;
  undefined8 uStack_127c;
  char *local_1270;
  undefined4 local_1268;
  undefined8 local_1264;
  undefined8 uStack_125c;
  undefined8 local_1254;
  undefined8 uStack_124c;
  char *local_1240;
  undefined4 local_1238;
  undefined8 local_1234;
  undefined8 uStack_122c;
  undefined8 local_1224;
  undefined8 uStack_121c;
  char *local_1210;
  undefined4 local_1208;
  undefined8 local_1204;
  undefined8 uStack_11fc;
  undefined8 local_11f4;
  undefined8 uStack_11ec;
  char *local_11e0;
  undefined4 local_11d8;
  undefined8 local_11d4;
  undefined8 uStack_11cc;
  undefined8 local_11c4;
  undefined8 uStack_11bc;
  char *local_11b0;
  undefined4 local_11a8;
  undefined8 local_11a4;
  undefined8 uStack_119c;
  undefined8 local_1194;
  undefined8 uStack_118c;
  char *local_1180;
  undefined4 local_1178;
  undefined8 local_1174;
  undefined8 uStack_116c;
  undefined8 local_1164;
  undefined8 uStack_115c;
  char *local_1150;
  undefined4 local_1148;
  undefined8 local_1144;
  undefined8 uStack_113c;
  undefined8 local_1134;
  undefined8 uStack_112c;
  char *local_1120;
  undefined4 local_1118;
  undefined8 local_1114;
  undefined8 uStack_110c;
  undefined8 local_1104;
  undefined8 uStack_10fc;
  char *local_10f0;
  undefined4 local_10e8;
  undefined8 local_10e4;
  undefined8 uStack_10dc;
  undefined8 local_10d4;
  undefined8 uStack_10cc;
  char *local_10c0;
  undefined4 local_10b8;
  undefined8 local_10b4;
  undefined8 uStack_10ac;
  undefined8 local_10a4;
  undefined8 uStack_109c;
  char *local_1090;
  undefined4 local_1088;
  undefined8 local_1084;
  undefined8 uStack_107c;
  undefined8 local_1074;
  undefined8 uStack_106c;
  char *local_1060;
  undefined4 local_1058;
  undefined8 local_1054;
  undefined8 uStack_104c;
  undefined8 local_1044;
  undefined8 uStack_103c;
  char *local_1030;
  undefined4 local_1028;
  undefined8 local_1024;
  undefined8 uStack_101c;
  undefined8 local_1014;
  undefined8 uStack_100c;
  char *local_1000;
  undefined4 local_ff8;
  undefined8 local_ff4;
  undefined8 uStack_fec;
  undefined8 local_fe4;
  undefined8 uStack_fdc;
  char *local_fd0;
  undefined4 local_fc8;
  undefined8 local_fc4;
  undefined8 uStack_fbc;
  undefined8 local_fb4;
  undefined8 uStack_fac;
  char *local_fa0;
  undefined4 local_f98;
  undefined8 local_f94;
  undefined8 uStack_f8c;
  undefined8 local_f84;
  undefined8 uStack_f7c;
  char *local_f70;
  undefined4 local_f68;
  undefined8 local_f64;
  undefined8 uStack_f5c;
  undefined8 local_f54;
  undefined8 uStack_f4c;
  char *local_f40;
  undefined4 local_f38;
  undefined8 local_f34;
  undefined8 uStack_f2c;
  undefined8 local_f24;
  undefined8 uStack_f1c;
  char *local_f10;
  undefined4 local_f08;
  undefined8 local_f04;
  undefined8 uStack_efc;
  undefined8 local_ef4;
  undefined8 uStack_eec;
  char *local_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined4 local_ec8;
  undefined8 local_ec4;
  undefined8 uStack_ebc;
  char *local_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined4 local_e98;
  undefined8 local_e94;
  undefined8 uStack_e8c;
  char *local_e80;
  undefined4 local_e78;
  undefined8 local_e74;
  undefined8 uStack_e6c;
  undefined8 local_e64;
  undefined8 uStack_e5c;
  char *local_e50;
  undefined4 local_e48;
  undefined8 local_e44;
  undefined8 uStack_e3c;
  undefined8 local_e34;
  undefined8 uStack_e2c;
  char *local_e20;
  undefined4 local_e18;
  undefined8 local_e14;
  undefined8 uStack_e0c;
  undefined8 local_e04;
  undefined8 uStack_dfc;
  char *local_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined4 local_dd8;
  undefined8 local_dd4;
  undefined8 uStack_dcc;
  char *local_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined4 local_da8;
  undefined8 local_da4;
  undefined8 uStack_d9c;
  char *local_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined4 local_d78;
  undefined8 local_d74;
  undefined8 uStack_d6c;
  char *local_d60;
  undefined4 local_d58;
  undefined8 local_d54;
  undefined8 uStack_d4c;
  undefined8 local_d44;
  undefined8 uStack_d3c;
  char *local_d30;
  undefined8 local_d28;
  undefined8 local_d20;
  undefined4 local_d18;
  undefined8 local_d14;
  undefined8 uStack_d0c;
  char *local_d00;
  undefined8 local_cf8;
  undefined8 local_cf0;
  undefined4 local_ce8;
  undefined8 local_ce4;
  undefined8 uStack_cdc;
  char *local_cd0;
  undefined8 local_cc8;
  undefined8 local_cc0;
  undefined4 local_cb8;
  undefined8 local_cb4;
  undefined8 uStack_cac;
  char *local_ca0;
  undefined8 local_c98;
  undefined8 local_c90;
  undefined4 local_c88;
  undefined8 local_c84;
  undefined8 uStack_c7c;
  char *local_c70;
  undefined8 local_c68;
  undefined8 local_c60;
  undefined4 local_c58;
  undefined8 local_c54;
  undefined8 uStack_c4c;
  char *local_c40;
  undefined8 local_c38;
  undefined8 local_c30;
  undefined4 local_c28;
  undefined8 local_c24;
  undefined8 uStack_c1c;
  char *local_c10;
  undefined8 local_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined4 local_be8;
  char *local_be0;
  undefined4 local_bd8;
  undefined8 local_bd4;
  undefined8 uStack_bcc;
  undefined8 local_bc4;
  undefined8 uStack_bbc;
  char *local_bb0;
  undefined8 local_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  undefined4 local_b88;
  char *local_b80;
  undefined4 local_b78;
  undefined8 local_b74;
  undefined8 uStack_b6c;
  undefined8 local_b64;
  undefined8 uStack_b5c;
  char *local_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined4 local_b38;
  undefined8 local_b34;
  undefined8 uStack_b2c;
  char *local_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  float local_b08;
  undefined8 local_b04;
  undefined8 uStack_afc;
  char *local_af0;
  undefined4 local_ae8;
  undefined8 local_ae4;
  undefined8 uStack_adc;
  undefined8 local_ad4;
  undefined8 uStack_acc;
  char *local_ac0;
  undefined4 local_ab8;
  undefined8 local_ab4;
  undefined8 uStack_aac;
  undefined8 local_aa4;
  undefined8 uStack_a9c;
  char *local_a90;
  undefined4 local_a88;
  undefined8 local_a84;
  undefined8 uStack_a7c;
  undefined8 local_a74;
  undefined8 uStack_a6c;
  char *local_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined4 local_a48;
  undefined8 local_a44;
  undefined8 uStack_a3c;
  char *local_a30;
  undefined4 local_a28;
  undefined8 local_a24;
  undefined8 uStack_a1c;
  undefined8 local_a14;
  undefined8 uStack_a0c;
  char *local_a00;
  undefined4 local_9f8;
  undefined8 local_9f4;
  undefined8 uStack_9ec;
  undefined8 local_9e4;
  undefined8 uStack_9dc;
  char *local_9d0;
  undefined4 local_9c8;
  undefined8 local_9c4;
  undefined8 uStack_9bc;
  undefined8 local_9b4;
  undefined8 uStack_9ac;
  char *local_9a0;
  undefined4 local_998;
  undefined8 local_994;
  undefined8 uStack_98c;
  undefined8 local_984;
  undefined8 uStack_97c;
  char *local_970;
  undefined4 local_968;
  undefined8 local_964;
  undefined8 uStack_95c;
  undefined8 local_954;
  undefined8 uStack_94c;
  char *local_940;
  undefined4 local_938;
  undefined8 local_934;
  undefined8 uStack_92c;
  undefined8 local_924;
  undefined8 uStack_91c;
  char *local_910;
  undefined4 local_908;
  undefined8 local_904;
  undefined8 uStack_8fc;
  undefined8 local_8f4;
  undefined8 uStack_8ec;
  char *local_8e0;
  undefined4 local_8d8;
  undefined8 local_8d4;
  undefined8 uStack_8cc;
  undefined8 local_8c4;
  undefined8 uStack_8bc;
  char *local_8b0;
  undefined4 local_8a8;
  undefined8 local_8a4;
  undefined8 uStack_89c;
  undefined8 local_894;
  undefined8 uStack_88c;
  char *local_880;
  undefined4 local_878;
  undefined8 local_874;
  undefined8 uStack_86c;
  undefined8 local_864;
  undefined8 uStack_85c;
  char *local_850;
  undefined4 local_848;
  undefined8 local_844;
  undefined8 uStack_83c;
  undefined8 local_834;
  undefined8 uStack_82c;
  char *local_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined4 local_808;
  undefined8 local_804;
  undefined8 uStack_7fc;
  char *local_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined4 local_7d8;
  undefined8 local_7d4;
  undefined8 uStack_7cc;
  char *local_7c0;
  undefined4 local_7b8;
  undefined8 local_7b4;
  undefined8 uStack_7ac;
  undefined8 local_7a4;
  undefined8 uStack_79c;
  char *local_790;
  undefined4 local_788;
  undefined8 local_784;
  undefined8 uStack_77c;
  undefined8 local_774;
  undefined8 uStack_76c;
  char *local_760;
  undefined4 local_758;
  undefined8 local_754;
  undefined8 uStack_74c;
  undefined8 local_744;
  undefined8 uStack_73c;
  char *local_730;
  undefined4 local_728;
  undefined8 local_724;
  undefined8 uStack_71c;
  undefined8 local_714;
  undefined8 uStack_70c;
  char *local_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined4 local_6e8;
  undefined8 local_6e4;
  undefined8 uStack_6dc;
  char *local_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined4 local_6b8;
  undefined8 local_6b4;
  undefined8 uStack_6ac;
  char *local_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  float local_688;
  undefined8 local_684;
  undefined8 uStack_67c;
  char *local_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined4 local_658;
  undefined8 local_654;
  undefined8 uStack_64c;
  char *local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined4 local_628;
  undefined8 local_624;
  undefined8 uStack_61c;
  char *local_610;
  undefined8 local_608;
  undefined8 uStack_600;
  float local_5f8;
  undefined8 local_5f4;
  undefined8 uStack_5ec;
  char *local_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined4 local_5c8;
  undefined8 local_5c4;
  undefined8 uStack_5bc;
  char *local_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined4 local_598;
  undefined8 local_594;
  undefined8 uStack_58c;
  char *local_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined4 local_568;
  undefined8 local_564;
  undefined8 uStack_55c;
  char *local_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined4 local_538;
  undefined8 local_534;
  undefined8 uStack_52c;
  char *local_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined4 local_508;
  undefined8 local_504;
  undefined8 uStack_4fc;
  char *local_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined4 local_4d8;
  undefined8 local_4d4;
  undefined8 uStack_4cc;
  char *local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a8;
  undefined8 local_4a4;
  undefined8 uStack_49c;
  char *local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 uStack_470;
  deUint8 buffer [856];
  VkPhysicalDeviceFeatures features;
  
  pTVar2 = context->m_testCtx->m_log;
  memset(buffer,0xcd,0x358);
  pIVar4 = Context::getInstanceInterface(context);
  pVVar5 = Context::getPhysicalDevice(context);
  (*pIVar4->_vptr_InstanceInterface[5])(pIVar4,pVVar5,buffer);
  pIVar4 = Context::getInstanceInterface(context);
  pVVar5 = Context::getPhysicalDevice(context);
  (*pIVar4->_vptr_InstanceInterface[2])(pIVar4,pVVar5,&features);
  poVar1 = &local_1c98.m_str;
  local_1c98.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"device = ");
  Context::getPhysicalDevice(context);
  std::ostream::_M_insert<void_const*>(poVar1);
  local_1b18 = (undefined1  [8])
               tcu::MessageBuilder::operator<<
                         (&local_1c98,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b10);
  ::vk::operator<<((ostream *)&local_1b10,(VkPhysicalDeviceProperties *)buffer);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b18,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b10);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  local_1b18 = (undefined1  [8])((ulong)local_1b18 & 0xffffffff00000000);
  local_1b10 = "maxImageDimension1D";
  local_1b08._0_4_ = 0x1000;
  local_1b08._4_8_ = 0;
  stack0xffffffffffffe504 = 0;
  stack0xffffffffffffe50c = 1;
  aiStack_1af0[1] = 0xffffffff;
  aiStack_1af0[2] = 4;
  local_1ae0 = "maxImageDimension2D";
  local_1ad8 = 0x1000;
  local_1ad4 = 0;
  uStack_1acc = 0;
  local_1ac4 = 1;
  uStack_1abc = 0x8ffffffff;
  local_1ab0 = "maxImageDimension3D";
  local_1aa8 = 0x100;
  local_1aa4 = 0;
  uStack_1a9c = 0;
  local_1a94 = 1;
  uStack_1a8c = 0xcffffffff;
  local_1a80 = "maxImageDimensionCube";
  local_1a78 = 0x1000;
  local_1a74 = 0;
  uStack_1a6c = 0;
  local_1a64 = 1;
  uStack_1a5c = 0x10ffffffff;
  local_1a50 = "maxImageArrayLayers";
  local_1a48 = 0x100;
  local_1a44 = 0;
  uStack_1a3c = 0;
  local_1a34 = 1;
  uStack_1a2c = 0x14ffffffff;
  local_1a20 = "maxTexelBufferElements";
  local_1a18 = 0x10000;
  local_1a14 = 0;
  uStack_1a0c = 0;
  local_1a04 = 1;
  uStack_19fc = 0x18ffffffff;
  local_19f0 = "maxUniformBufferRange";
  local_19e8 = 0x4000;
  local_19e4 = 0;
  uStack_19dc = 0;
  local_19d4 = 1;
  uStack_19cc = 0x1cffffffff;
  local_19c0 = "maxStorageBufferRange";
  local_19b8 = 0;
  uStack_19b0 = 0;
  local_19a8 = 0;
  local_19a4 = 0x200000001;
  uStack_199c = 0x20ffffffff;
  local_1990 = "maxPushConstantsSize";
  local_1988 = 0x80;
  local_1984 = 0;
  uStack_197c = 0;
  local_1974 = 1;
  uStack_196c = 0x24ffffffff;
  local_1960 = "maxMemoryAllocationCount";
  local_1958 = 0x1000;
  local_1954 = 0;
  uStack_194c = 0;
  local_1944 = 1;
  uStack_193c = 0x28ffffffff;
  local_1930 = "maxSamplerAllocationCount";
  local_1928 = 0;
  uStack_1920 = 0;
  local_1918 = 0;
  local_1914 = 0x200000001;
  uStack_190c = 0x30ffffffff;
  local_1900 = "bufferImageGranularity";
  local_18f8 = 0;
  local_18f0 = 1;
  local_18e8 = 0;
  local_18e4 = 3;
  uStack_18dc = 0x30ffffffff;
  local_18d0 = "bufferImageGranularity";
  local_18c8 = 0;
  local_18c0 = 0x20000;
  local_18b8 = 0;
  local_18b4 = 0x100000003;
  uStack_18ac = 0x38ffffffff;
  local_18a0 = "sparseAddressSpaceSize";
  local_1898 = 0;
  local_1890 = 0x80000000;
  local_1888 = 0;
  local_1884 = 3;
  uStack_187c = 0x40ffffffff;
  local_1870 = "maxBoundDescriptorSets";
  uVar14 = 4;
  local_1864 = 0;
  uStack_185c = 0;
  local_1854 = 1;
  uStack_184c = 0x44ffffffff;
  local_1840 = "maxPerStageDescriptorSamplers";
  local_1838 = 0x10;
  local_1834 = 0;
  uStack_182c = 0;
  local_1824 = 1;
  uStack_181c = 0x48ffffffff;
  local_1810 = "maxPerStageDescriptorUniformBuffers";
  local_1808 = 0xc;
  local_1804 = 0;
  uStack_17fc = 0;
  local_17f4 = 1;
  uStack_17ec = 0x4cffffffff;
  local_17e0 = "maxPerStageDescriptorStorageBuffers";
  local_17d4 = 0;
  uStack_17cc = 0;
  local_17c4 = 1;
  uStack_17bc = 0x50ffffffff;
  local_17b0 = "maxPerStageDescriptorSampledImages";
  local_17a4 = 0;
  uStack_179c = 0;
  local_1794 = 1;
  uStack_178c = 0x54ffffffff;
  local_1780 = "maxPerStageDescriptorStorageImages";
  local_1774 = 0;
  uStack_176c = 0;
  local_1764 = 1;
  uStack_175c = 0x58ffffffff;
  local_1750 = "maxPerStageDescriptorInputAttachments";
  local_1744 = 0;
  uStack_173c = 0;
  local_1734 = 1;
  uStack_172c = 0x5cffffffff;
  local_1720 = "maxPerStageResources";
  local_1718 = 0;
  uStack_1710 = 0;
  local_1708 = 0;
  local_1704 = 0x200000001;
  uStack_16fc = 0x60ffffffff;
  local_16f0 = "maxDescriptorSetSamplers";
  local_16e8 = 0x60;
  local_16e4 = 0;
  uStack_16dc = 0;
  local_16d4 = 1;
  uStack_16cc = 0x64ffffffff;
  local_16c0 = "maxDescriptorSetUniformBuffers";
  local_16b8 = 0x48;
  local_16b4 = 0;
  uStack_16ac = 0;
  local_16a4 = 1;
  uStack_169c = 0x68ffffffff;
  local_1690 = "maxDescriptorSetUniformBuffersDynamic";
  uVar16 = 8;
  local_1684 = 0;
  uStack_167c = 0;
  local_1674 = 1;
  uStack_166c = 0x6cffffffff;
  local_1660 = "maxDescriptorSetStorageBuffers";
  local_1658 = 0x18;
  local_1654 = 0;
  uStack_164c = 0;
  local_1644 = 1;
  uStack_163c = 0x70ffffffff;
  local_1630 = "maxDescriptorSetStorageBuffersDynamic";
  local_1624 = 0;
  uStack_161c = 0;
  local_1614 = 1;
  uStack_160c = 0x74ffffffff;
  local_1600 = "maxDescriptorSetSampledImages";
  local_15f4 = 0;
  uStack_15ec = 0;
  local_15e4 = 1;
  uStack_15dc = 0x78ffffffff;
  local_15d0 = "maxDescriptorSetStorageImages";
  local_15c4 = 0;
  uStack_15bc = 0;
  local_15b4 = 1;
  uStack_15ac = 0x7cffffffff;
  local_15a0 = "maxDescriptorSetInputAttachments";
  local_1588 = 0;
  local_1598 = 0;
  uStack_1590 = 0;
  local_1584 = 0x200000001;
  uStack_157c = 0x80ffffffff;
  local_1570 = "maxVertexInputAttributes";
  local_1564 = 0;
  uStack_155c = 0;
  local_1554 = 1;
  uStack_154c = 0x84ffffffff;
  local_1540 = "maxVertexInputBindings";
  local_1534 = 0;
  uStack_152c = 0;
  local_1524 = 1;
  uStack_151c = 0x88ffffffff;
  local_1510 = "maxVertexInputAttributeOffset";
  local_1508 = 0x7ff;
  local_1504 = 0;
  uStack_14fc = 0;
  local_14f4 = 1;
  uStack_14ec = 0x8cffffffff;
  local_14e0 = "maxVertexInputBindingStride";
  local_14d8 = 0x800;
  local_14d4 = 0;
  uStack_14cc = 0;
  local_14c4 = 1;
  uStack_14bc = 0x90ffffffff;
  local_14b0 = "maxVertexOutputComponents";
  local_14a8 = 0x40;
  local_14a4 = 0;
  uStack_149c = 0;
  local_1494 = 1;
  uStack_148c = 0x94ffffffff;
  local_1480 = "maxTessellationGenerationLevel";
  local_1474 = 0;
  uStack_146c = 0;
  local_1464 = 1;
  uStack_145c = 0x98ffffffff;
  local_1450 = "maxTessellationPatchSize";
  local_1448 = 0x20;
  local_1444 = 0;
  uStack_143c = 0;
  local_1434 = 1;
  uStack_142c = 0x9cffffffff;
  local_1420 = "maxTessellationControlPerVertexInputComponents";
  local_1414 = 0;
  uStack_140c = 0;
  local_1404 = 1;
  uStack_13fc = 0xa0ffffffff;
  local_13f0 = "maxTessellationControlPerVertexOutputComponents";
  local_13e4 = 0;
  uStack_13dc = 0;
  local_13d4 = 1;
  uStack_13cc = 0xa4ffffffff;
  local_13c0 = "maxTessellationControlPerPatchOutputComponents";
  local_13b8 = 0x78;
  local_13b4 = 0;
  uStack_13ac = 0;
  local_13a4 = 1;
  uStack_139c = 0xa8ffffffff;
  local_1390 = "maxTessellationControlTotalOutputComponents";
  local_1388 = 0x800;
  local_1384 = 0;
  uStack_137c = 0;
  local_1374 = 1;
  uStack_136c = 0xacffffffff;
  local_1360 = "maxTessellationEvaluationInputComponents";
  local_1354 = 0;
  uStack_134c = 0;
  local_1344 = 1;
  uStack_133c = 0xb0ffffffff;
  local_1330 = "maxTessellationEvaluationOutputComponents";
  local_1324 = 0;
  uStack_131c = 0;
  local_1314 = 1;
  uStack_130c = 0xb4ffffffff;
  local_1300 = "maxGeometryShaderInvocations";
  local_12f4 = 0;
  uStack_12ec = 0;
  local_12e4 = 1;
  uStack_12dc = 0xb8ffffffff;
  local_12d0 = "maxGeometryInputComponents";
  local_12c4 = 0;
  uStack_12bc = 0;
  local_12b4 = 1;
  uStack_12ac = 0xbcffffffff;
  local_12a0 = "maxGeometryOutputComponents";
  local_1294 = 0;
  uStack_128c = 0;
  local_1284 = 1;
  uStack_127c = 0xc0ffffffff;
  local_1270 = "maxGeometryOutputVertices";
  local_1268 = 0x100;
  local_1264 = 0;
  uStack_125c = 0;
  local_1254 = 1;
  uStack_124c = 0xc4ffffffff;
  local_1240 = "maxGeometryTotalOutputComponents";
  local_1238 = 0x400;
  local_1234 = 0;
  uStack_122c = 0;
  local_1224 = 1;
  uStack_121c = 0xc8ffffffff;
  local_1210 = "maxFragmentInputComponents";
  local_1204 = 0;
  uStack_11fc = 0;
  local_11f4 = 1;
  uStack_11ec = 0xccffffffff;
  local_11e0 = "maxFragmentOutputAttachments";
  local_11d4 = 0;
  uStack_11cc = 0;
  local_11c4 = 1;
  uStack_11bc = 0xd0ffffffff;
  local_11b0 = "maxFragmentDualSrcAttachments";
  uVar15 = 1;
  local_11a4 = 0;
  uStack_119c = 0;
  local_1194 = 1;
  uStack_118c = 0xd4ffffffff;
  local_1180 = "maxFragmentCombinedOutputResources";
  local_1174 = 0;
  uStack_116c = 0;
  local_1164 = 1;
  uStack_115c = 0xd8ffffffff;
  local_1150 = "maxComputeSharedMemorySize";
  local_1148 = 0x4000;
  local_1144 = 0;
  uStack_113c = 0;
  local_1134 = 1;
  uStack_112c = 0xdcffffffff;
  local_1120 = "maxComputeWorkGroupCount[0]";
  local_1118 = 0xffff;
  local_1114 = 0;
  uStack_110c = 0;
  local_1104 = 1;
  uStack_10fc = 0xe0ffffffff;
  local_10f0 = "maxComputeWorkGroupCount[1]";
  local_10e8 = 0xffff;
  local_10e4 = 0;
  uStack_10dc = 0;
  local_10d4 = 1;
  uStack_10cc = 0xe4ffffffff;
  local_10c0 = "maxComputeWorkGroupCount[2]";
  local_10b8 = 0xffff;
  local_10b4 = 0;
  uStack_10ac = 0;
  local_10a4 = 1;
  uStack_109c = 0xe8ffffffff;
  local_1090 = "maxComputeWorkGroupInvocations";
  local_1088 = 0x80;
  local_1084 = 0;
  uStack_107c = 0;
  local_1074 = 1;
  uStack_106c = 0xecffffffff;
  local_1060 = "maxComputeWorkGroupSize[0]";
  local_1058 = 0x80;
  local_1054 = 0;
  uStack_104c = 0;
  local_1044 = 1;
  uStack_103c = 0xf0ffffffff;
  local_1030 = "maxComputeWorkGroupSize[1]";
  local_1028 = 0x80;
  local_1024 = 0;
  uStack_101c = 0;
  local_1014 = 1;
  uStack_100c = 0xf4ffffffff;
  local_1000 = "maxComputeWorkGroupSize[2]";
  local_ff4 = 0;
  uStack_fec = 0;
  local_fe4 = 1;
  uStack_fdc = 0xf8ffffffff;
  local_fd0 = "subPixelPrecisionBits";
  local_fc4 = 0;
  uStack_fbc = 0;
  local_fb4 = 1;
  uStack_fac = 0xfcffffffff;
  local_fa0 = "subTexelPrecisionBits";
  local_f94 = 0;
  uStack_f8c = 0;
  local_f84 = 1;
  uStack_f7c = 0x100ffffffff;
  local_f70 = "mipmapPrecisionBits";
  local_f64 = 0;
  uStack_f5c = 0;
  local_f54 = 1;
  uStack_f4c = 0x104ffffffff;
  local_f40 = "maxDrawIndexedIndexValue";
  local_f38 = 0xffffffff;
  local_f34 = 0;
  uStack_f2c = 0;
  local_f24 = 1;
  uStack_f1c = 0x108ffffffff;
  local_f10 = "maxDrawIndirectCount";
  local_f08 = 0xffff;
  local_f04 = 0;
  uStack_efc = 0;
  local_ef4 = 1;
  uStack_eec = 0x10cffffffff;
  local_ee0 = "maxSamplerLodBias";
  local_ed8 = 0;
  uStack_ed0 = 0;
  local_ec8 = 0x40000000;
  local_ec4 = 2;
  uStack_ebc = 0x110ffffffff;
  local_eb0 = "maxSamplerAnisotropy";
  local_ea8 = 0;
  uStack_ea0 = 0;
  local_e98 = 0x41800000;
  local_e94 = 2;
  uStack_e8c = 0x114ffffffff;
  local_e80 = "maxViewports";
  local_e74 = 0;
  uStack_e6c = 0;
  local_e64 = 1;
  uStack_e5c = 0x118ffffffff;
  local_e50 = "maxViewportDimensions[0]";
  local_e48 = 0x1000;
  local_e44 = 0;
  uStack_e3c = 0;
  local_e34 = 1;
  uStack_e2c = 0x11cffffffff;
  local_e20 = "maxViewportDimensions[1]";
  local_e18 = 0x1000;
  local_e14 = 0;
  uStack_e0c = 0;
  local_e04 = 1;
  uStack_dfc = 0x120ffffffff;
  local_df0 = "viewportBoundsRange[0]";
  local_de8 = 0;
  uStack_de0 = 0;
  local_dd8 = 0xc6000000;
  local_dd4 = 0x100000002;
  uStack_dcc = 0x124ffffffff;
  local_dc0 = "viewportBoundsRange[1]";
  local_db8 = 0;
  uStack_db0 = 0;
  local_da8 = 0x45fff800;
  local_da4 = 2;
  uStack_d9c = 0x128ffffffff;
  local_d90 = "viewportSubPixelBits";
  local_d88 = 0;
  uStack_d80 = 0;
  local_d78 = 0;
  local_d74 = 1;
  uStack_d6c = 0x130ffffffff;
  local_d60 = "minMemoryMapAlignment";
  local_d54 = 0;
  uStack_d4c = 0;
  local_d44 = 1;
  uStack_d3c = 0x138ffffffff;
  local_d30 = "minTexelBufferOffsetAlignment";
  local_d28 = 0;
  local_d20 = 1;
  local_d18 = 0;
  local_d14 = 3;
  uStack_d0c = 0x138ffffffff;
  local_d00 = "minTexelBufferOffsetAlignment";
  local_cf8 = 0;
  local_cf0 = 0x100;
  local_ce8 = 0;
  local_ce4 = 0x100000003;
  uStack_cdc = 0x140ffffffff;
  local_cd0 = "minUniformBufferOffsetAlignment";
  local_cc8 = 0;
  local_cc0 = 1;
  local_cb8 = 0;
  local_cb4 = 3;
  uStack_cac = 0x140ffffffff;
  local_ca0 = "minUniformBufferOffsetAlignment";
  local_c98 = 0;
  local_c90 = 0x100;
  local_c88 = 0;
  local_c84 = 0x100000003;
  uStack_c7c = 0x148ffffffff;
  local_c70 = "minStorageBufferOffsetAlignment";
  local_c68 = 0;
  local_c60 = 1;
  local_c58 = 0;
  local_c54 = 3;
  uStack_c4c = 0x148ffffffff;
  local_c40 = "minStorageBufferOffsetAlignment";
  local_c38 = 0;
  local_c30 = 0x100;
  local_c28 = 0;
  value = (VkPhysicalDeviceLimits *)(buffer + 0x128);
  local_c24 = 0x100000003;
  uStack_c1c = 0x150ffffffff;
  local_c10 = "minTexelOffset";
  local_c08 = 0xfffffff800000000;
  local_c00 = 0;
  uStack_bf8 = 0;
  local_bf0 = 0xffffffff00000001;
  local_be8 = 0x154;
  local_be0 = "maxTexelOffset";
  local_bd8 = 7;
  local_bd4 = 0;
  uStack_bcc = 0;
  local_bc4 = 1;
  uStack_bbc = 0x158ffffffff;
  local_bb0 = "minTexelGatherOffset";
  local_ba8 = 0xfffffff800000000;
  local_ba0 = 0;
  uStack_b98 = 0;
  local_b90 = 0xffffffff00000001;
  local_b88 = 0x15c;
  local_b80 = "maxTexelGatherOffset";
  local_b74 = 0;
  uStack_b6c = 0;
  local_b64 = 1;
  uStack_b5c = 0x160ffffffff;
  local_b50 = "minInterpolationOffset";
  local_b48 = 0;
  uStack_b40 = 0;
  local_b38 = 0xbf000000;
  local_b34 = 0x100000002;
  uStack_b2c = 0x164ffffffff;
  local_b20 = "maxInterpolationOffset";
  local_b18 = 0;
  uStack_b10 = 0;
  local_1868 = uVar14;
  local_17d8 = uVar14;
  local_17a8 = local_1838;
  local_1778 = uVar14;
  local_1748 = uVar14;
  local_1688 = uVar16;
  local_1628 = uVar14;
  local_15f8 = local_16e8;
  local_15c8 = local_1658;
  local_1568 = local_1838;
  local_1538 = local_1838;
  local_1478 = local_14a8;
  local_1418 = local_14a8;
  local_13e8 = local_14a8;
  local_1358 = local_14a8;
  local_1328 = local_14a8;
  local_12f8 = local_1448;
  local_12c8 = local_14a8;
  local_1298 = local_14a8;
  local_1208 = local_14a8;
  local_11d8 = uVar14;
  local_11a8 = uVar15;
  local_1178 = uVar14;
  local_ff8 = local_14a8;
  local_fc8 = uVar14;
  local_f98 = uVar14;
  local_f68 = uVar14;
  local_e78 = local_1838;
  local_d58 = local_14a8;
  local_b78 = local_bd8;
  fVar17 = exp2f((float)(uint)buffer._656_4_);
  local_b08 = -1.0 / fVar17 + 0.5;
  local_b04 = 2;
  uStack_afc = 0x168ffffffff;
  local_af0 = "subPixelInterpolationOffsetBits";
  local_ae4 = 0;
  uStack_adc = 0;
  local_ad4 = 1;
  uStack_acc = 0x16cffffffff;
  local_ac0 = "maxFramebufferWidth";
  local_ab8 = 0x1000;
  local_ab4 = 0;
  uStack_aac = 0;
  local_aa4 = 1;
  uStack_a9c = 0x170ffffffff;
  local_a90 = "maxFramebufferHeight";
  local_a88 = 0x1000;
  local_a84 = 0;
  uStack_a7c = 0;
  local_a74 = 1;
  uStack_a6c = 0x174ffffffff;
  local_a60 = "maxFramebufferLayers";
  local_a48 = 0;
  local_a58 = 0;
  uStack_a50 = 0;
  local_a44 = 1;
  uStack_a3c = 0x178ffffffff;
  local_a30 = "framebufferColorSampleCounts";
  local_a28 = 5;
  local_a24 = 0;
  uStack_a1c = 0;
  local_a14 = 4;
  uStack_a0c = 0x17cffffffff;
  local_a00 = "framebufferDepthSampleCounts";
  local_9f4 = 0;
  uStack_9ec = 0;
  local_9e4 = 4;
  uStack_9dc = 0x180ffffffff;
  local_9d0 = "framebufferStencilSampleCounts";
  local_9c4 = 0;
  uStack_9bc = 0;
  local_9b4 = 4;
  uStack_9ac = 0x184ffffffff;
  local_9a0 = "framebufferNoAttachmentsSampleCounts";
  local_994 = 0;
  uStack_98c = 0;
  local_984 = 4;
  uStack_97c = 0x188ffffffff;
  local_970 = "maxColorAttachments";
  local_964 = 0;
  uStack_95c = 0;
  local_954 = 1;
  uStack_94c = 0x18cffffffff;
  local_940 = "sampledImageColorSampleCounts";
  local_934 = 0;
  uStack_92c = 0;
  local_924 = 4;
  uStack_91c = 0x190ffffffff;
  local_910 = "sampledImageIntegerSampleCounts";
  local_904 = 0;
  uStack_8fc = 0;
  local_8f4 = 4;
  uStack_8ec = 0x194ffffffff;
  local_8e0 = "sampledImageDepthSampleCounts";
  local_8d4 = 0;
  uStack_8cc = 0;
  local_8c4 = 4;
  uStack_8bc = 0x198ffffffff;
  local_8b0 = "sampledImageStencilSampleCounts";
  local_8a4 = 0;
  uStack_89c = 0;
  local_894 = 4;
  uStack_88c = 0x19cffffffff;
  local_880 = "storageImageSampleCounts";
  local_874 = 0;
  uStack_86c = 0;
  local_864 = 4;
  uStack_85c = 0x1a0ffffffff;
  local_850 = "maxSampleMaskWords";
  local_844 = 0;
  uStack_83c = 0;
  local_834 = 1;
  uStack_82c = 0x1a4ffffffff;
  local_820 = "timestampComputeAndGraphics";
  local_808 = 0;
  local_818 = 0;
  uStack_810 = 0;
  local_804 = 0x200000001;
  uStack_7fc = 0x1a8ffffffff;
  local_7f0 = "timestampPeriod";
  local_7d8 = 0;
  local_7e8 = 0;
  uStack_7e0 = 0;
  local_7d4 = 0x200000001;
  uStack_7cc = 0x1acffffffff;
  local_7c0 = "maxClipDistances";
  local_7b4 = 0;
  uStack_7ac = 0;
  local_7a4 = 1;
  uStack_79c = 0x1b0ffffffff;
  local_790 = "maxCullDistances";
  local_784 = 0;
  uStack_77c = 0;
  local_774 = 1;
  uStack_76c = 0x1b4ffffffff;
  local_760 = "maxCombinedClipAndCullDistances";
  local_754 = 0;
  uStack_74c = 0;
  local_744 = 1;
  uStack_73c = 0x1b8ffffffff;
  local_730 = "discreteQueuePriorities";
  local_724 = 0;
  uStack_71c = 0;
  local_714 = 0x200000001;
  uStack_70c = 0x1bcffffffff;
  local_700 = "pointSizeRange[0]";
  local_6e8 = 0;
  local_6f8 = 0;
  uStack_6f0 = 0;
  local_6e4 = 2;
  uStack_6dc = 0x1bcffffffff;
  local_6d0 = "pointSizeRange[0]";
  local_6c8 = 0;
  uStack_6c0 = 0;
  local_6b8 = 0x3f800000;
  local_6b4 = 0x100000002;
  uStack_6ac = 0x1c0ffffffff;
  local_6a0 = "pointSizeRange[1]";
  local_698 = 0;
  uStack_690 = 0;
  local_688 = 64.0 - (float)buffer._756_4_;
  local_684 = 2;
  uStack_67c = 0x1c4ffffffff;
  local_670 = "lineWidthRange[0]";
  local_668 = 0;
  uStack_660 = 0;
  local_658 = 0;
  local_654 = 2;
  uStack_64c = 0x1c4ffffffff;
  local_640 = "lineWidthRange[0]";
  local_638 = 0;
  uStack_630 = 0;
  local_628 = 0x3f800000;
  local_624 = 0x100000002;
  uStack_61c = 0x1c8ffffffff;
  local_610 = "lineWidthRange[1]";
  local_608 = 0;
  uStack_600 = 0;
  local_5f8 = 8.0 - (float)buffer._760_4_;
  local_5f4 = 2;
  uStack_5ec = 0x1ccffffffff;
  local_5e0 = "pointSizeGranularity";
  local_5d8 = 0;
  uStack_5d0 = 0;
  local_5c8 = 0x3f800000;
  local_5c4 = 0x100000002;
  uStack_5bc = 0x1d0ffffffff;
  local_5b0 = "lineWidthGranularity";
  local_5a8 = 0;
  uStack_5a0 = 0;
  local_598 = 0x3f800000;
  local_594 = 0x100000002;
  uStack_58c = 0x1d4ffffffff;
  local_580 = "strictLines";
  local_568 = 0;
  local_578 = 0;
  uStack_570 = 0;
  local_564 = 0x200000001;
  uStack_55c = 0x1d8ffffffff;
  local_550 = "standardSampleLocations";
  local_538 = 0;
  local_548 = 0;
  uStack_540 = 0;
  local_534 = 0x200000001;
  uStack_52c = 0x1e0ffffffff;
  local_520 = "optimalBufferCopyOffsetAlignment";
  local_508 = 0;
  local_518 = 0;
  uStack_510 = 0;
  local_504 = 0x200000003;
  uStack_4fc = 0x1e8ffffffff;
  local_4f0 = "optimalBufferCopyRowPitchAlignment";
  local_4d8 = 0;
  local_4e8 = 0;
  uStack_4e0 = 0;
  local_4d4 = 0x200000003;
  uStack_4cc = 0x1f0ffffffff;
  local_4c0 = "nonCoherentAtomSize";
  local_4b8 = 0;
  local_4b0 = 1;
  local_4a8 = 0;
  local_4a4 = 3;
  uStack_49c = 0x1f0ffffffff;
  local_490 = "nonCoherentAtomSize";
  local_488 = 0;
  local_480 = 0x100;
  local_478 = 0x300000000;
  uStack_470 = 0xffffffff00000001;
  poVar1 = &local_1c98.m_str;
  local_1c98.m_log = pTVar2;
  local_ae8 = uVar14;
  local_9f8 = local_a28;
  local_9c8 = local_a28;
  local_998 = local_a28;
  local_968 = uVar14;
  local_938 = local_a28;
  local_908 = uVar15;
  local_8d8 = local_a28;
  local_8a8 = local_a28;
  local_878 = local_a28;
  local_848 = uVar15;
  local_7b8 = uVar16;
  local_788 = uVar16;
  local_758 = uVar16;
  local_728 = uVar16;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  ::vk::operator<<((ostream *)poVar1,value);
  tcu::MessageBuilder::operator<<(&local_1c98,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  for (lVar6 = 0; lVar6 != 0x79; lVar6 = lVar6 + 1) {
    piVar13 = &DAT_00bf8150;
    for (lVar12 = 0; lVar12 != 0x22; lVar12 = lVar12 + 1) {
      if (*piVar13 == *(int *)(local_1b18 + lVar6 * 0x30)) {
        aiStack_1af0[lVar6 * 0xc + 1] = (int)lVar12;
        break;
      }
      piVar13 = piVar13 + 0xc;
    }
  }
  bVar3 = true;
  for (lVar6 = 0; lVar6 != 0x16b0; lVar6 = lVar6 + 0x30) {
    switch(*(undefined4 *)((long)afStack_1af8 + lVar6 + 4)) {
    case 0:
      iVar9 = *(int *)(local_1b08 + lVar6 + 4);
      lVar12 = (long)*(int *)((long)aiStack_1af0 + lVar6 + 4);
      if ((lVar12 != -1) &&
         (lVar12 = lVar12 * 0x30,
         *(int *)((long)&features.robustBufferAccess + (ulong)*(uint *)(&DAT_00bf8160 + lVar12)) ==
         0)) {
        iVar9 = *(int *)(&DAT_00bf8168 + lVar12);
      }
      if (*(int *)((long)aiStack_1af0 + lVar6) == 1) {
        if (iVar9 < *(int *)(buffer + (ulong)*(uint *)(local_1b18 + lVar6) + 0x128)) {
          local_1c98.m_log = pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c98.m_str);
          std::operator<<((ostream *)&local_1c98.m_str,"limit validation failed, ");
          pMVar7 = tcu::MessageBuilder::operator<<(&local_1c98,(char **)((long)&local_1b10 + lVar6))
          ;
          std::operator<<((ostream *)&pMVar7->m_str," not valid-limit type MAX actual is ");
          pMVar7 = tcu::MessageBuilder::operator<<
                             (pMVar7,(int *)((long)&value->maxImageDimension1D +
                                            (ulong)*(uint *)(local_1b18 + lVar6)));
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_004a022e;
        }
      }
      else if ((*(int *)((long)aiStack_1af0 + lVar6) == 0) &&
              (*(int *)(buffer + (ulong)*(uint *)(local_1b18 + lVar6) + 0x128) < iVar9)) {
        local_1c98.m_log = pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c98.m_str);
        std::operator<<((ostream *)&local_1c98.m_str,"limit validation failed, ");
        pMVar7 = tcu::MessageBuilder::operator<<(&local_1c98,(char **)((long)&local_1b10 + lVar6));
        std::operator<<((ostream *)&pMVar7->m_str," not valid-limit type MIN actual is ");
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(int *)((long)&value->maxImageDimension1D +
                                          (ulong)*(uint *)(local_1b18 + lVar6)));
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_004a022e:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c98.m_str);
        goto switchD_0049fc13_default;
      }
      break;
    case 1:
      uVar10 = *(uint *)(local_1b08 + lVar6);
      lVar12 = (long)*(int *)((long)aiStack_1af0 + lVar6 + 4);
      if ((lVar12 != -1) &&
         (lVar12 = lVar12 * 0x30,
         *(int *)((long)&features.robustBufferAccess + (ulong)*(uint *)(&DAT_00bf8160 + lVar12)) ==
         0)) {
        uVar10 = *(uint *)(&DAT_00bf8164 + lVar12);
      }
      if (*(int *)((long)aiStack_1af0 + lVar6) == 1) {
        if (uVar10 < *(uint *)(buffer + (ulong)*(uint *)(local_1b18 + lVar6) + 0x128)) {
          local_1c98.m_log = pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c98.m_str);
          std::operator<<((ostream *)&local_1c98.m_str,"limit validation failed,  ");
          pMVar7 = tcu::MessageBuilder::operator<<(&local_1c98,(char **)((long)&local_1b10 + lVar6))
          ;
          std::operator<<((ostream *)&pMVar7->m_str," not valid-limit type MAX - actual is ");
          pMVar7 = tcu::MessageBuilder::operator<<
                             (pMVar7,(uint *)((long)&value->maxImageDimension1D +
                                             (ulong)*(uint *)(local_1b18 + lVar6)));
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_004a022e;
        }
      }
      else if ((*(int *)((long)aiStack_1af0 + lVar6) == 0) &&
              (*(uint *)(buffer + (ulong)*(uint *)(local_1b18 + lVar6) + 0x128) < uVar10)) {
        local_1c98.m_log = pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c98.m_str);
        std::operator<<((ostream *)&local_1c98.m_str,"limit Validation failed ");
        pMVar7 = tcu::MessageBuilder::operator<<(&local_1c98,(char **)((long)&local_1b10 + lVar6));
        std::operator<<((ostream *)&pMVar7->m_str," not valid-limit type MIN - actual is ");
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(uint *)((long)&value->maxImageDimension1D +
                                           (ulong)*(uint *)(local_1b18 + lVar6)));
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_004a022e;
      }
      break;
    case 2:
      fVar17 = *(float *)((long)afStack_1af8 + lVar6);
      lVar12 = (long)*(int *)((long)aiStack_1af0 + lVar6 + 4);
      if ((lVar12 != -1) &&
         (lVar12 = lVar12 * 0x30,
         *(int *)((long)&features.robustBufferAccess + (ulong)*(uint *)(&DAT_00bf8160 + lVar12)) ==
         0)) {
        fVar17 = *(float *)(&DAT_00bf8178 + lVar12);
      }
      if (*(int *)((long)aiStack_1af0 + lVar6) == 1) {
        if (fVar17 < *(float *)(buffer + (ulong)*(uint *)(local_1b18 + lVar6) + 0x128)) {
          local_1c98.m_log = pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c98.m_str);
          std::operator<<((ostream *)&local_1c98.m_str,"limit validation failed, ");
          pMVar7 = tcu::MessageBuilder::operator<<(&local_1c98,(char **)((long)&local_1b10 + lVar6))
          ;
          std::operator<<((ostream *)&pMVar7->m_str," not valid-limit type MAX actual is ");
          pMVar7 = tcu::MessageBuilder::operator<<
                             (pMVar7,(float *)((long)&value->maxImageDimension1D +
                                              (ulong)*(uint *)(local_1b18 + lVar6)));
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_004a022e;
        }
      }
      else if ((*(int *)((long)aiStack_1af0 + lVar6) == 0) &&
              (*(float *)(buffer + (ulong)*(uint *)(local_1b18 + lVar6) + 0x128) <= fVar17 &&
               fVar17 != *(float *)(buffer + (ulong)*(uint *)(local_1b18 + lVar6) + 0x128))) {
        local_1c98.m_log = pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c98.m_str);
        std::operator<<((ostream *)&local_1c98.m_str,"limit validation failed, ");
        pMVar7 = tcu::MessageBuilder::operator<<(&local_1c98,(char **)((long)&local_1b10 + lVar6));
        std::operator<<((ostream *)&pMVar7->m_str," not valid-limit type MIN - actual is ");
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(float *)((long)&value->maxImageDimension1D +
                                            (ulong)*(uint *)(local_1b18 + lVar6)));
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_004a022e;
      }
      break;
    case 3:
      uVar11 = *(ulong *)(local_1b08 + lVar6 + 8);
      lVar12 = (long)*(int *)((long)aiStack_1af0 + lVar6 + 4);
      if ((lVar12 != -1) &&
         (lVar12 = lVar12 * 0x30,
         *(int *)((long)&features.robustBufferAccess + (ulong)*(uint *)(&DAT_00bf8160 + lVar12)) ==
         0)) {
        uVar11 = *(ulong *)(&DAT_00bf8170 + lVar12);
      }
      if (*(int *)((long)aiStack_1af0 + lVar6) == 1) {
        if (uVar11 < *(ulong *)(buffer + (ulong)*(uint *)(local_1b18 + lVar6) + 0x128)) {
          local_1c98.m_log = pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c98.m_str);
          std::operator<<((ostream *)&local_1c98.m_str,"limit validation failed, ");
          pMVar7 = tcu::MessageBuilder::operator<<(&local_1c98,(char **)((long)&local_1b10 + lVar6))
          ;
          std::operator<<((ostream *)&pMVar7->m_str," not valid-limit type MAX actual is ");
          pMVar7 = tcu::MessageBuilder::operator<<
                             (pMVar7,(unsigned_long *)
                                     ((long)&value->maxImageDimension1D +
                                     (ulong)*(uint *)(local_1b18 + lVar6)));
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_004a022e;
        }
      }
      else if ((*(int *)((long)aiStack_1af0 + lVar6) == 0) &&
              (*(ulong *)(buffer + (ulong)*(uint *)(local_1b18 + lVar6) + 0x128) < uVar11)) {
        local_1c98.m_log = pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c98.m_str);
        std::operator<<((ostream *)&local_1c98.m_str,"limit validation failed, ");
        pMVar7 = tcu::MessageBuilder::operator<<(&local_1c98,(char **)((long)&local_1b10 + lVar6));
        std::operator<<((ostream *)&pMVar7->m_str," not valid-limit type MIN actual is ");
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(unsigned_long *)
                                   ((long)&value->maxImageDimension1D +
                                   (ulong)*(uint *)(local_1b18 + lVar6)));
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_004a022e;
      }
      break;
    case 4:
      uVar10 = *(uint *)(local_1b08 + lVar6);
      lVar12 = (long)*(int *)((long)aiStack_1af0 + lVar6 + 4);
      if ((lVar12 != -1) &&
         (lVar12 = lVar12 * 0x30,
         *(int *)((long)&features.robustBufferAccess + (ulong)*(uint *)(&DAT_00bf8160 + lVar12)) ==
         0)) {
        uVar10 = *(uint *)(&DAT_00bf8164 + lVar12);
      }
      if ((*(int *)((long)aiStack_1af0 + lVar6) == 0) &&
         ((uVar10 & ~*(uint *)(buffer + (ulong)*(uint *)(local_1b18 + lVar6) + 0x128)) != 0)) {
        local_1c98.m_log = pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c98.m_str);
        std::operator<<((ostream *)&local_1c98.m_str,"limit validation failed, ");
        pMVar7 = tcu::MessageBuilder::operator<<(&local_1c98,(char **)((long)&local_1b10 + lVar6));
        std::operator<<((ostream *)&pMVar7->m_str," not valid-limit type bitmask actual is ");
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(unsigned_long *)
                                   ((long)&value->maxImageDimension1D +
                                   (ulong)*(uint *)(local_1b18 + lVar6)));
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_004a022e;
      }
      break;
    default:
switchD_0049fc13_default:
      bVar3 = false;
    }
  }
  value_00 = (uint *)(buffer + 0x240);
  poVar1 = &local_1c98.m_str;
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    if (*value_00 < (uint)buffer._300_4_) {
      local_1c98.m_log = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"limit validation failed, maxImageDimension2D of ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,"is larger than maxViewportDimension[");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,"] of ");
      pMVar7 = tcu::MessageBuilder::operator<<(&local_1c98,value_00);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      bVar3 = false;
    }
    value_00 = value_00 + 1;
  }
  if ((float)(uint)(buffer._576_4_ * -2) < (float)buffer._584_4_) {
    poVar1 = &local_1c98.m_str;
    local_1c98.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"limit validation failed, viewPortBoundsRange[0] of ");
    std::ostream::operator<<(poVar1,(float)buffer._584_4_);
    std::operator<<((ostream *)poVar1,"is larger than -2*maxViewportDimension[0] of ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<(&local_1c98,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    bVar3 = false;
  }
  if ((float)(buffer._580_4_ * 2 - 1) <= (float)buffer._588_4_) {
    if (bVar3) {
      for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 1) {
        if (buffer[lVar6 + 0x338] != 0xcd) {
          local_1b18 = (undefined1  [8])pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b10);
          std::operator<<((ostream *)&local_1b10,"deviceProperties - Guard offset ");
          std::ostream::operator<<((ostringstream *)&local_1b10,(int)lVar6);
          std::operator<<((ostream *)&local_1b10," not valid");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b18,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1b18,"deviceProperties buffer overflow",
                     (allocator<char> *)&local_1c98);
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1b18);
          goto LAB_004a0473;
        }
      }
      pVVar5 = Context::getPhysicalDevice(context);
      pIVar4 = Context::getInstanceInterface(context);
      bVar3 = ::vk::ValidateQueryBits::
              validateInitComplete<vk::VkPhysicalDevice_s*,vk::InstanceInterface,vk::VkPhysicalDeviceProperties>
                        ((ValidateQueryBits *)pVVar5,(VkPhysicalDevice_s *)0x29,0,pIVar4,
                         (QueryMemberTableEntry *)
                         &api::(anonymous_namespace)::s_physicalDevicePropertiesOffsetTable);
      if (bVar3) {
        sVar8 = deStrnlen((char *)(buffer + 0x14),0x100);
        if (sVar8 == 0x100) {
          local_1b18 = (undefined1  [8])pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b10);
          std::operator<<((ostream *)&local_1b10,
                          "deviceProperties - VkPhysicalDeviceProperties deviceName not properly initialized"
                         );
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b18,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1b18,"deviceProperties incomplete initialization",
                     (allocator<char> *)&local_1c98);
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1b18);
        }
        else {
          AVar18 = ::vk::unpackVersion(buffer._0_4_);
          AVar19 = ::vk::unpackVersion(0x400000);
          if (AVar18.majorNum == AVar19.majorNum) {
            if (AVar19._0_8_ >> 0x20 < AVar18._0_8_ >> 0x20) {
              local_1b18 = (undefined1  [8])pTVar2;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b10);
              std::operator<<((ostream *)&local_1b10,"deviceProperties - API Minor Version ");
              std::ostream::_M_insert<unsigned_long>((ulong)&local_1b10);
              std::operator<<((ostream *)&local_1b10," is not valid for this version of dEQP");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b18,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b10);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_1b18,"deviceProperties apiVersion not valid",
                         (allocator<char> *)&local_1c98);
              tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1b18);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_1b18,"DeviceProperites query succeeded",
                         (allocator<char> *)&local_1c98);
              tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_1b18);
            }
          }
          else {
            local_1b18 = (undefined1  [8])pTVar2;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b10);
            std::operator<<((ostream *)&local_1b10,"deviceProperties - API Major Version ");
            std::ostream::_M_insert<unsigned_long>((ulong)&local_1b10);
            std::operator<<((ostream *)&local_1b10," is not valid");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b18,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1b18,"deviceProperties apiVersion not valid",
                       (allocator<char> *)&local_1c98);
            tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1b18);
          }
        }
      }
      else {
        local_1b18 = (undefined1  [8])pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b10);
        std::operator<<((ostream *)&local_1b10,
                        "deviceProperties - VkPhysicalDeviceProperties not completely initialized");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b18,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b18,"deviceProperties incomplete initialization",
                   (allocator<char> *)&local_1c98);
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1b18);
      }
      goto LAB_004a0473;
    }
  }
  else {
    poVar1 = &local_1c98.m_str;
    local_1c98.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"limit validation failed, viewportBoundsRange[1] of ");
    pMVar7 = tcu::MessageBuilder::operator<<(&local_1c98,(float *)(buffer + 0x24c));
    std::operator<<((ostream *)&pMVar7->m_str,"is less than 2*maxViewportDimension[1] of ");
    std::ostream::_M_insert<unsigned_long>((ulong)&pMVar7->m_str);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b18,"deviceProperties - feature limits failed",
             (allocator<char> *)&local_1c98);
  tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1b18);
LAB_004a0473:
  std::__cxx11::string::~string((string *)local_1b18);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus deviceProperties (Context& context)
{
	using namespace ValidateQueryBits;

	TestLog&						log			= context.getTestContext().getLog();
	VkPhysicalDeviceProperties*		props;
	VkPhysicalDeviceFeatures		features;
	deUint8							buffer[sizeof(VkPhysicalDeviceProperties) + GUARD_SIZE];

	props = reinterpret_cast<VkPhysicalDeviceProperties*>(buffer);
	deMemset(props, GUARD_VALUE, sizeof(buffer));

	context.getInstanceInterface().getPhysicalDeviceProperties(context.getPhysicalDevice(), props);
	context.getInstanceInterface().getPhysicalDeviceFeatures(context.getPhysicalDevice(), &features);

	log << TestLog::Message << "device = " << context.getPhysicalDevice() << TestLog::EndMessage
		<< TestLog::Message << *props << TestLog::EndMessage;

	if (!validateFeatureLimits(props, &features, log))
		return tcu::TestStatus::fail("deviceProperties - feature limits failed");

	for (int ndx = 0; ndx < GUARD_SIZE; ndx++)
	{
		if (buffer[ndx + sizeof(VkPhysicalDeviceProperties)] != GUARD_VALUE)
		{
			log << TestLog::Message << "deviceProperties - Guard offset " << ndx << " not valid" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceProperties buffer overflow");
		}
	}

	if (!validateInitComplete(context.getPhysicalDevice(), &InstanceInterface::getPhysicalDeviceProperties, context.getInstanceInterface(), s_physicalDevicePropertiesOffsetTable))
	{
		log << TestLog::Message << "deviceProperties - VkPhysicalDeviceProperties not completely initialized" << TestLog::EndMessage;
		return tcu::TestStatus::fail("deviceProperties incomplete initialization");
	}

	// Check if deviceName string is properly terminated.
	if (deStrnlen(props->deviceName, VK_MAX_PHYSICAL_DEVICE_NAME_SIZE) == VK_MAX_PHYSICAL_DEVICE_NAME_SIZE)
	{
		log << TestLog::Message << "deviceProperties - VkPhysicalDeviceProperties deviceName not properly initialized" << TestLog::EndMessage;
		return tcu::TestStatus::fail("deviceProperties incomplete initialization");
	}

	{
		const ApiVersion deviceVersion = unpackVersion(props->apiVersion);
		const ApiVersion deqpVersion = unpackVersion(VK_API_VERSION);

		if (deviceVersion.majorNum != deqpVersion.majorNum)
		{
			log << TestLog::Message << "deviceProperties - API Major Version " << deviceVersion.majorNum << " is not valid" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceProperties apiVersion not valid");
		}

		if (deviceVersion.minorNum > deqpVersion.minorNum)
		{
			log << TestLog::Message << "deviceProperties - API Minor Version " << deviceVersion.minorNum << " is not valid for this version of dEQP" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceProperties apiVersion not valid");
		}
	}

	return tcu::TestStatus::pass("DeviceProperites query succeeded");
}